

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,
          GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *old)

{
  pair<QModelIndex,_QPersistentModelIndex> *ppVar1;
  QPersistentModelIndexData *pQVar2;
  Data *pDVar3;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar4;
  undefined1 *puVar5;
  bool bVar6;
  quintptr qVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar11;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0 &&
      where == GrowsAtEnd) {
    pDVar3 = this->d;
    if (pDVar3 == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pDVar3 == (Data *)0x0) {
        lVar9 = 0;
        lVar10 = 0;
      }
      else {
        lVar9 = (pDVar3->super_QArrayData).alloc;
        lVar10 = (this->size - (pDVar3->super_QArrayData).alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 5);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QtPrivate::QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::reallocate
                  ((QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this,
                   lVar9 + n + lVar10,Grow);
        return;
      }
      goto LAB_0049c056;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (pair<QModelIndex,_QPersistentModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  ppVar4 = local_48.ptr;
  if ((n < 1) || (local_48.ptr != (pair<QModelIndex,_QPersistentModelIndex> *)0x0)) {
    if (this->size != 0) {
      lVar9 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar6 = true;
      }
      else {
        bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      ppVar12 = this->ptr;
      ppVar11 = ppVar12 + lVar9;
      if ((old != (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0) ||
         (bVar6)) {
        if ((lVar9 != 0) && (0 < lVar9)) {
          do {
            ppVar1 = ppVar4 + local_48.size;
            (ppVar1->first).m.ptr = (ppVar12->first).m.ptr;
            iVar8 = (ppVar12->first).c;
            qVar7 = (ppVar12->first).i;
            (ppVar1->first).r = (ppVar12->first).r;
            (ppVar1->first).c = iVar8;
            (ppVar1->first).i = qVar7;
            QPersistentModelIndex::QPersistentModelIndex(&ppVar1->second,&ppVar12->second);
            local_48.size = local_48.size + 1;
            ppVar12 = ppVar12 + 1;
          } while (ppVar12 < ppVar11);
        }
      }
      else if ((lVar9 != 0) && (0 < lVar9)) {
        do {
          local_48.ptr[local_48.size].first.m.ptr = (ppVar12->first).m.ptr;
          iVar8 = (ppVar12->first).c;
          qVar7 = (ppVar12->first).i;
          ppVar4 = local_48.ptr + local_48.size;
          (ppVar4->first).r = (ppVar12->first).r;
          (ppVar4->first).c = iVar8;
          (ppVar4->first).i = qVar7;
          pQVar2 = (ppVar12->second).d;
          (ppVar12->second).d = (QPersistentModelIndexData *)0x0;
          local_48.ptr[local_48.size].second.d = pQVar2;
          ppVar12 = ppVar12 + 1;
          local_48.size = local_48.size + 1;
        } while (ppVar12 < ppVar11);
      }
    }
    pDVar3 = this->d;
    ppVar4 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar5 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar3;
    local_48.ptr = ppVar4;
    local_48.size = (qsizetype)puVar5;
    if (old != (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar3;
      old->ptr = ppVar4;
      local_48.size = old->size;
      old->size = (qsizetype)puVar5;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    qBadAlloc();
  }
LAB_0049c056:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }